

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack15_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  uVar1 = *in;
  *out = uVar1 & 0x7fff;
  uVar2 = in[1];
  out[1] = uVar1 >> 0xf & 0x7fff;
  out[2] = uVar1 >> 0x1e;
  out[2] = uVar1 >> 0x1e | (uVar2 & 0x1fff) << 2;
  out[3] = uVar2 >> 0xd & 0x7fff;
  out[4] = uVar2 >> 0x1c;
  uVar1 = in[2];
  out[4] = uVar2 >> 0x1c | (uVar1 & 0x7ff) << 4;
  out[5] = uVar1 >> 0xb & 0x7fff;
  out[6] = uVar1 >> 0x1a;
  uVar2 = in[3];
  out[6] = uVar1 >> 0x1a | (uVar2 & 0x1ff) << 6;
  out[7] = uVar2 >> 9 & 0x7fff;
  out[8] = uVar2 >> 0x18;
  uVar1 = in[4];
  out[8] = uVar2 >> 0x18 | (uVar1 & 0x7f) << 8;
  out[9] = uVar1 >> 7 & 0x7fff;
  uVar2 = in[5];
  out[10] = uVar1 >> 0x16;
  out[10] = uVar1 >> 0x16 | (uVar2 & 0x1f) << 10;
  out[0xb] = uVar2 >> 5 & 0x7fff;
  uVar1 = in[6];
  out[0xc] = uVar2 >> 0x14;
  out[0xc] = uVar2 >> 0x14 | (uVar1 & 7) << 0xc;
  uVar2 = in[7];
  out[0xd] = uVar1 >> 3 & 0x7fff;
  out[0xe] = uVar1 >> 0x12;
  out[0xe] = uVar1 >> 0x12 | (uVar2 & 1) << 0xe;
  auVar4 = vpbroadcastd_avx512vl();
  auVar4 = vpsrlvd_avx2(auVar4,_DAT_001a9070);
  auVar3._8_4_ = 0x7fff;
  auVar3._0_8_ = 0x7fff00007fff;
  auVar3._12_4_ = 0x7fff;
  auVar4 = vpandd_avx512vl(auVar4,auVar3);
  *(long *)(out + 0xf) = auVar4._0_8_;
  out[0x11] = uVar2 >> 0x1f;
  uVar1 = in[8];
  out[0x11] = uVar2 >> 0x1f | (uVar1 & 0x3fff) << 1;
  out[0x12] = uVar1 >> 0xe & 0x7fff;
  out[0x13] = uVar1 >> 0x1d;
  uVar2 = in[9];
  out[0x13] = uVar1 >> 0x1d | (uVar2 & 0xfff) << 3;
  out[0x14] = uVar2 >> 0xc & 0x7fff;
  uVar1 = in[10];
  out[0x15] = uVar2 >> 0x1b;
  out[0x15] = uVar2 >> 0x1b | (uVar1 & 0x3ff) << 5;
  out[0x16] = uVar1 >> 10 & 0x7fff;
  uVar2 = in[0xb];
  out[0x17] = uVar1 >> 0x19;
  out[0x17] = (uVar2 & 0xff) << 7 | uVar1 >> 0x19;
  return in + 0xc;
}

Assistant:

const uint32_t *__fastunpack15_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 15);
  out++;
  *out = ((*in) >> 15) % (1U << 15);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 13)) << (15 - 13);
  out++;
  *out = ((*in) >> 13) % (1U << 15);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 11)) << (15 - 11);
  out++;
  *out = ((*in) >> 11) % (1U << 15);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 9)) << (15 - 9);
  out++;
  *out = ((*in) >> 9) % (1U << 15);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 7)) << (15 - 7);
  out++;
  *out = ((*in) >> 7) % (1U << 15);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 5)) << (15 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 15);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 3)) << (15 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 15);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 1)) << (15 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 15);
  out++;
  *out = ((*in) >> 16) % (1U << 15);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 14)) << (15 - 14);
  out++;
  *out = ((*in) >> 14) % (1U << 15);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 12)) << (15 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 15);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 10)) << (15 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 15);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 8)) << (15 - 8);
  out++;

  return in + 1;
}